

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HonokaMiku.cc
# Opt level: O0

int32_t GetGameProp(char *str)

{
  int iVar1;
  size_t sVar2;
  uint local_28;
  uint local_24;
  uint32_t defver;
  uint32_t defver_1;
  uint32_t game_prop;
  char *str_local;
  
  defver = 0xffffffff;
  if ((str[1] == '\0') || (str[2] == '\0')) {
    if ((str[1] == '\0') || (('9' < str[1] || (str[1] < '1')))) {
      local_28 = 0x30000;
    }
    else {
      local_28 = (str[1] + -0x30) * 0x10000;
    }
    if (*str == 'j') {
      defver = local_28;
    }
    else if (*str == 'w') {
      defver = local_28 | 1;
    }
    else if (*str == 't') {
      defver = local_28 | 2;
    }
    else if (*str == 'c') {
      defver = local_28 | 3;
    }
  }
  if (defver == 0xffffffff) {
    sVar2 = strlen(str);
    if (sVar2 == 9) {
      local_24 = (int)str[8] - 0x30;
      if ((local_24 == 0) || (9 < local_24)) {
        return -1;
      }
      local_24 = local_24 * 0x10000;
    }
    else {
      local_24 = 0x30000;
    }
    iVar1 = msvcr110_strnicmp(str,"sif-jp",6);
    if (iVar1 == 0) {
      str_local._4_4_ = local_24;
    }
    else {
      iVar1 = msvcr110_strnicmp(str,"sif-ww",6);
      if ((iVar1 == 0) || (iVar1 = msvcr110_strnicmp(str,"sif-en",6), iVar1 == 0)) {
        str_local._4_4_ = local_24 | 1;
      }
      else {
        iVar1 = msvcr110_strnicmp(str,"sif-tw",6);
        if (iVar1 == 0) {
          str_local._4_4_ = local_24 | 2;
        }
        else {
          iVar1 = msvcr110_strnicmp(str,"sif-cn",6);
          if (iVar1 == 0) {
            str_local._4_4_ = local_24 | 3;
          }
          else {
            str_local._4_4_ = 0xffffffff;
          }
        }
      }
    }
  }
  else {
    str_local._4_4_ = defver;
  }
  return str_local._4_4_;
}

Assistant:

int32_t GetGameProp(const char* str)
{
	uint32_t game_prop = (-1);

	// Single character check
	if(str[1] == 0 || str[2] == 0)
	{
		uint32_t defver = (str[1] == 0 || str[1] > 57 || str[1] < 49 ? HONOKAMIKU_DECRYPT_V3 : int32_t(str[1] - 48) << 16);

		if(str[0] == 'j')
			game_prop = HONOKAMIKU_GAMETYPE_JP | defver;
		else if(str[0] == 'w')
			game_prop = HONOKAMIKU_GAMETYPE_EN | defver;
		else if(str[0] == 't')
			game_prop = HONOKAMIKU_GAMETYPE_TW | defver;
		else if(str[0] == 'c')
			game_prop = HONOKAMIKU_GAMETYPE_CN | defver;
	}

	if(game_prop != 0xFFFFFFFF)
		return game_prop;

	// Multi-character-check
	uint32_t defver = (-1);

	if(strlen(str) == 9)
	{
		defver = int32_t(str[8] - 48);

		if(defver < 1 || defver > 9)
			return (-1);
		else
			defver <<= 16;
	}
	else
		defver = HONOKAMIKU_DECRYPT_V3;

	if(msvcr110_strnicmp(str, "sif-jp", 6) == 0)
		return HONOKAMIKU_GAMETYPE_JP | defver;
	else if(
		msvcr110_strnicmp(str, "sif-ww", 6) == 0 ||
		msvcr110_strnicmp(str, "sif-en", 6) == 0
	)
		return HONOKAMIKU_GAMETYPE_EN | defver;
	else if(msvcr110_strnicmp(str, "sif-tw", 6) == 0)
		return HONOKAMIKU_GAMETYPE_TW | defver;
	else if(msvcr110_strnicmp(str, "sif-cn", 6) == 0)
		return HONOKAMIKU_GAMETYPE_CN | defver;
	
	return (-1);
}